

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::anon_unknown_1::InvariantOuterEdgeCase::init
          (InvariantOuterEdgeCase *this,EVP_PKEY_CTX *ctx)

{
  deInt32 *pdVar1;
  pointer *ppPVar2;
  ostringstream *this_00;
  Context *pCVar3;
  RenderContext *renderCtx;
  pointer pPVar4;
  pointer pPVar5;
  SharedPtrStateBase *pSVar6;
  TestLog *log;
  InvariantOuterEdgeCase *pIVar7;
  byte bVar8;
  RenderTarget *pRVar9;
  undefined8 extraout_RAX;
  long *plVar10;
  ShaderProgram *pSVar11;
  ulong uVar12;
  pointer pPVar13;
  pointer pPVar14;
  undefined8 uVar15;
  TestError *this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  ContextInfo *pCVar17;
  size_type *psVar18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar19;
  Context *code;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 uVar20;
  long lVar21;
  undefined1 in_R9B;
  pointer pPVar22;
  size_type *psVar23;
  ulong uVar24;
  pointer pPVar25;
  uint uVar26;
  int iVar27;
  ulong uVar28;
  bool bVar29;
  Winding winding;
  string fragmentShaderTemplate;
  ScopedLogSection section;
  string tessellationEvaluationTemplate;
  string tessellationControlTemplate;
  string floatLit01;
  string vertexShaderTemplate;
  undefined1 local_3f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e8;
  Winding local_3cc;
  size_type *local_3c8;
  value_type local_3c0;
  undefined1 local_3a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_390;
  size_type *local_378;
  value_type local_370;
  Winding local_350;
  bool local_34c;
  ShaderProgram *local_348;
  SharedPtrStateBase *local_340;
  ShaderProgram *local_338;
  SharedPtrStateBase *local_330;
  ulong local_328;
  undefined1 local_320 [32];
  InvariantOuterEdgeCase *local_300;
  uint local_2f8;
  uint local_2f4;
  string local_2f0;
  Context *local_2d0;
  long local_2c8;
  Context local_2c0;
  long local_2a8;
  undefined1 local_2a0 [16];
  ContextInfo *local_290;
  pointer local_288;
  undefined1 local_280 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260;
  _Base_ptr local_250 [2];
  TestContext *local_240 [2];
  undefined1 local_230 [32];
  string local_210;
  string local_1f0;
  string local_1d0;
  undefined1 local_1b0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0 [3];
  ios_base local_140 [8];
  ios_base local_138 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_120;
  deUint32 local_108;
  undefined1 local_100 [208];
  
  checkTessellationSupport((this->super_TestCase).m_context);
  pRVar9 = Context::getRenderTarget((this->super_TestCase).m_context);
  checkRenderTargetSize
            ((Functional *)(ulong)(uint)pRVar9->m_width,
             (RenderTarget *)(ulong)(uint)pRVar9->m_height,0x10);
  uVar15 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
  local_3cc = WINDING_CCW;
  uVar20 = extraout_RDX;
  local_300 = this;
  do {
    local_2f8 = (uint)uVar15;
    winding = WINDING_CCW;
    uVar15 = CONCAT71((int7)((ulong)uVar15 >> 8),1);
    do {
      psVar23 = &local_370._M_string_length;
      local_2f4 = (uint)uVar15;
      uVar26 = (int)((ulong)((long)(this->m_programs).
                                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->m_programs).
                                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555;
      de::floatToString_abi_cxx11_
                ((string *)(local_280 + 0x10),(de *)0x2,10.0 / (float)(int)(uVar26 + 10),(int)uVar20
                );
      local_250[0] = (_Base_ptr)local_240;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_250,
                 "${GLSL_VERSION_DECL}\n\nin highp float in_v_attr;\nout highp float in_tc_attr;\n\nvoid main (void)\n{\n\tin_tc_attr = in_v_attr;\n}\n"
                 ,"");
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
      local_328 = (ulong)uVar26;
      std::ostream::operator<<((ostringstream *)local_1b0,uVar26 + 1);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
      std::ios_base::~ios_base(local_140);
      plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_378,0,(char *)0x0,0x952b57);
      local_3f8._0_8_ = &local_3e8;
      paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar10 == paVar16) {
        local_3e8._M_allocated_capacity = paVar16->_M_allocated_capacity;
        local_3e8._8_8_ = plVar10[3];
      }
      else {
        local_3e8._M_allocated_capacity = paVar16->_M_allocated_capacity;
        local_3f8._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar10;
      }
      local_3f8._8_8_ = plVar10[1];
      *plVar10 = (long)paVar16;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append(local_3f8);
      local_2c0.m_contextInfo = (ContextInfo *)local_2a0;
      pCVar17 = (ContextInfo *)(plVar10 + 2);
      if ((ContextInfo *)*plVar10 == pCVar17) {
        local_2a0._0_8_ = pCVar17->_vptr_ContextInfo;
        local_2a0._8_8_ = plVar10[3];
      }
      else {
        local_2a0._0_8_ = pCVar17->_vptr_ContextInfo;
        local_2c0.m_contextInfo = (ContextInfo *)*plVar10;
      }
      local_2a8 = plVar10[1];
      *plVar10 = (long)pCVar17;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f8._0_8_ != &local_3e8) {
        operator_delete((void *)local_3f8._0_8_,local_3e8._M_allocated_capacity + 1);
      }
      if (local_378 != psVar23) {
        operator_delete(local_378,local_370._M_string_length + 1);
      }
      bVar29 = SUB41(winding,0);
      (anonymous_namespace)::getTessellationEvaluationInLayoutString_abi_cxx11_
                ((string *)local_320,(_anonymous_namespace_ *)(ulong)this->m_primitiveType,
                 this->m_spacing,local_3cc,winding,(bool)in_R9B);
      plVar10 = (long *)std::__cxx11::string::replace((ulong)local_320,0,(char *)0x0,0x9521e9);
      local_3c8 = &local_3c0._M_string_length;
      psVar18 = (size_type *)(plVar10 + 2);
      if ((size_type *)*plVar10 == psVar18) {
        local_3c0._M_string_length = *psVar18;
        local_3c0.field_2._M_allocated_capacity = plVar10[3];
      }
      else {
        local_3c0._M_string_length = *psVar18;
        local_3c8 = (size_type *)*plVar10;
      }
      local_3c0._M_dataplus._M_p = (pointer)plVar10[1];
      *plVar10 = (long)psVar18;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_3c8);
      local_3a0._0_8_ = &local_390;
      paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar10 == paVar16) {
        local_390._M_allocated_capacity = paVar16->_M_allocated_capacity;
        local_390._8_8_ = plVar10[3];
      }
      else {
        local_390._M_allocated_capacity = paVar16->_M_allocated_capacity;
        local_3a0._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar10;
      }
      local_3a0._8_8_ = plVar10[1];
      *plVar10 = (long)paVar16;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::_M_append(local_3a0,local_280._16_8_);
      psVar18 = (size_type *)(plVar10 + 2);
      if ((size_type *)*plVar10 == psVar18) {
        local_370._M_string_length = *psVar18;
        local_370.field_2._M_allocated_capacity = plVar10[3];
        local_378 = psVar23;
      }
      else {
        local_370._M_string_length = *psVar18;
        local_378 = (size_type *)*plVar10;
      }
      local_370._M_dataplus._M_p = (pointer)plVar10[1];
      *plVar10 = (long)psVar18;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_378);
      local_3f8._0_8_ = &local_3e8;
      paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar10 == paVar16) {
        local_3e8._M_allocated_capacity = paVar16->_M_allocated_capacity;
        local_3e8._8_8_ = plVar10[3];
      }
      else {
        local_3e8._M_allocated_capacity = paVar16->_M_allocated_capacity;
        local_3f8._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar10;
      }
      local_3f8._8_8_ = plVar10[1];
      *plVar10 = (long)paVar16;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::_M_append(local_3f8,local_280._16_8_);
      pbVar19 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(plVar10 + 2);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar10 == pbVar19)
      {
        local_1a0[0]._M_dataplus._M_p = (pbVar19->_M_dataplus)._M_p;
        local_1a0[0]._M_string_length = plVar10[3];
        local_1b0._0_8_ = local_1a0;
      }
      else {
        local_1a0[0]._M_dataplus._M_p = (pbVar19->_M_dataplus)._M_p;
        local_1b0._0_8_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar10;
      }
      local_1b0._8_8_ = plVar10[1];
      *plVar10 = (long)pbVar19;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append(local_1b0);
      local_2d0 = &local_2c0;
      code = (Context *)(plVar10 + 2);
      if ((Context *)*plVar10 == code) {
        local_2c0.m_testCtx = code->m_testCtx;
        local_2c0.m_renderCtx = (RenderContext *)plVar10[3];
      }
      else {
        local_2c0.m_testCtx = code->m_testCtx;
        local_2d0 = (Context *)*plVar10;
      }
      local_2c8 = plVar10[1];
      *plVar10 = (long)code;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0._0_8_ !=
          local_1a0) {
        operator_delete((void *)local_1b0._0_8_,(ulong)(local_1a0[0]._M_dataplus._M_p + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f8._0_8_ != &local_3e8) {
        operator_delete((void *)local_3f8._0_8_,local_3e8._M_allocated_capacity + 1);
      }
      if (local_378 != psVar23) {
        operator_delete(local_378,local_370._M_string_length + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a0._0_8_ != &local_390) {
        operator_delete((void *)local_3a0._0_8_,local_390._M_allocated_capacity + 1);
      }
      if (local_3c8 != &local_3c0._M_string_length) {
        operator_delete(local_3c8,local_3c0._M_string_length + 1);
      }
      if ((Context *)local_320._0_8_ != (Context *)(local_320 + 0x10)) {
        operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
      }
      local_320._0_8_ = local_320 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_320,
                 "${GLSL_VERSION_DECL}\n\nlayout (location = 0) out mediump vec4 o_color;\n\nin highp vec4 in_f_color;\n\nvoid main (void)\n{\n\to_color = in_f_color;\n}\n"
                 ,"");
      pSVar11 = (ShaderProgram *)operator_new(0xd0);
      pCVar3 = (this->super_TestCase).m_context;
      renderCtx = pCVar3->m_renderCtx;
      memset(local_1b0,0,0xac);
      local_100._0_8_ = (pointer)0x0;
      local_100[8] = 0;
      local_100._9_7_ = 0;
      local_100[0x10] = 0;
      local_100._17_8_ = 0;
      (anonymous_namespace)::specializeShader_abi_cxx11_
                (&local_2f0,(_anonymous_namespace_ *)pCVar3->m_renderCtx,(Context *)local_250[0],
                 (char *)code);
      local_3f8._0_8_ = local_3f8._0_8_ & 0xffffffff00000000;
      local_3f8._8_8_ = local_3e8._M_local_buf + 8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_3f8 + 8),local_2f0._M_dataplus._M_p,
                 local_2f0._M_dataplus._M_p + local_2f0._M_string_length);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_1b0 + (local_3f8._0_8_ & 0xffffffff) * 0x18),
                  (value_type *)(local_3f8 + 8));
      pIVar7 = local_300;
      (anonymous_namespace)::specializeShader_abi_cxx11_
                (&local_1d0,
                 (_anonymous_namespace_ *)((local_300->super_TestCase).m_context)->m_renderCtx,
                 (Context *)local_2c0.m_contextInfo,(char *)code);
      local_378 = (size_type *)CONCAT44(local_378._4_4_,3);
      local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_370,local_1d0._M_dataplus._M_p,
                 local_1d0._M_dataplus._M_p + local_1d0._M_string_length);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_1b0 + ((ulong)local_378 & 0xffffffff) * 0x18),&local_370);
      (anonymous_namespace)::specializeShader_abi_cxx11_
                (&local_1f0,
                 (_anonymous_namespace_ *)((pIVar7->super_TestCase).m_context)->m_renderCtx,
                 local_2d0,(char *)code);
      local_3a0._0_4_ = 4;
      local_3a0._8_8_ = local_390._M_local_buf + 8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_3a0 + 8),local_1f0._M_dataplus._M_p,
                 local_1f0._M_dataplus._M_p + local_1f0._M_string_length);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_1b0 + (local_3a0._0_8_ & 0xffffffff) * 0x18),
                  (value_type *)(local_3a0 + 8));
      (anonymous_namespace)::specializeShader_abi_cxx11_
                (&local_210,
                 (_anonymous_namespace_ *)((pIVar7->super_TestCase).m_context)->m_renderCtx,
                 (Context *)local_320._0_8_,(char *)code);
      local_3c8 = (size_type *)CONCAT44(local_3c8._4_4_,1);
      local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_3c0,local_210._M_dataplus._M_p,
                 local_210._M_dataplus._M_p + local_210._M_string_length);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_1b0 + ((ulong)local_3c8 & 0xffffffff) * 0x18),&local_3c0);
      local_290 = (ContextInfo *)local_280;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"out_te_tessCoord","");
      local_230._0_8_ = local_230 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_230,local_290,
                 (undefined1 *)((long)&(local_288->_M_dataplus)._M_p + (long)local_290));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_100,(value_type *)local_230);
      local_108 = 0x8c8c;
      glu::ShaderProgram::ShaderProgram(pSVar11,renderCtx,(ProgramSources *)local_1b0);
      local_330 = (SharedPtrStateBase *)0x0;
      local_338 = pSVar11;
      local_340 = (SharedPtrStateBase *)operator_new(0x20);
      local_340->strongRefCount = 0;
      local_340->weakRefCount = 0;
      local_340->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b2a1a8;
      local_340[1]._vptr_SharedPtrStateBase = (_func_int **)pSVar11;
      local_340->strongRefCount = 1;
      local_340->weakRefCount = 1;
      local_350 = local_3cc;
      LOCK();
      local_340->strongRefCount = local_340->strongRefCount + 1;
      UNLOCK();
      LOCK();
      local_340->weakRefCount = local_340->weakRefCount + 1;
      UNLOCK();
      pPVar4 = (pIVar7->m_programs).
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_34c = bVar29;
      local_348 = pSVar11;
      local_330 = local_340;
      if (pPVar4 == (pIVar7->m_programs).
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        pPVar5 = (pIVar7->m_programs).
                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((long)pPVar4 - (long)pPVar5 == 0x7ffffffffffffff8) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        lVar21 = (long)pPVar4 - (long)pPVar5 >> 3;
        uVar24 = lVar21 * -0x5555555555555555;
        uVar12 = uVar24;
        if (pPVar4 == pPVar5) {
          uVar12 = 1;
        }
        uVar28 = uVar12 + uVar24;
        if (0x555555555555554 < uVar28) {
          uVar28 = 0x555555555555555;
        }
        if (CARRY8(uVar12,uVar24)) {
          uVar28 = 0x555555555555555;
        }
        if (uVar28 == 0) {
          pPVar13 = (pointer)0x0;
        }
        else {
          pPVar13 = (pointer)operator_new(uVar28 * 0x18);
        }
        (&pPVar13->usePointMode)[lVar21 * 8] = local_34c;
        (&pPVar13->winding)[lVar21 * 2] = local_350;
        (&(pPVar13->program).m_ptr)[lVar21] = local_348;
        (&(pPVar13->program).m_state)[lVar21] = local_340;
        if (local_340 != (SharedPtrStateBase *)0x0) {
          LOCK();
          local_340->strongRefCount = local_340->strongRefCount + 1;
          UNLOCK();
          LOCK();
          pdVar1 = &(&(pPVar13->program).m_state)[lVar21]->weakRefCount;
          *pdVar1 = *pdVar1 + 1;
          UNLOCK();
        }
        pPVar22 = pPVar13 + 1;
        pPVar14 = pPVar5;
        if (pPVar4 != pPVar5) {
          do {
            pPVar22[-1].usePointMode = pPVar14->usePointMode;
            pPVar22[-1].winding = pPVar14->winding;
            pPVar22[-1].program.m_ptr = (pPVar14->program).m_ptr;
            pSVar6 = (pPVar14->program).m_state;
            pPVar22[-1].program.m_state = pSVar6;
            if (pSVar6 != (SharedPtrStateBase *)0x0) {
              LOCK();
              pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
              UNLOCK();
              LOCK();
              pdVar1 = &(pPVar22[-1].program.m_state)->weakRefCount;
              *pdVar1 = *pdVar1 + 1;
              UNLOCK();
            }
            pPVar14 = pPVar14 + 1;
            pPVar22 = pPVar22 + 1;
            pPVar25 = pPVar5;
          } while (pPVar14 != pPVar4);
          do {
            pSVar6 = (pPVar25->program).m_state;
            if (pSVar6 != (SharedPtrStateBase *)0x0) {
              LOCK();
              pdVar1 = &pSVar6->strongRefCount;
              *pdVar1 = *pdVar1 + -1;
              UNLOCK();
              if (*pdVar1 == 0) {
                (pPVar25->program).m_ptr = (ShaderProgram *)0x0;
                (*((pPVar25->program).m_state)->_vptr_SharedPtrStateBase[2])();
              }
              LOCK();
              pdVar1 = &((pPVar25->program).m_state)->weakRefCount;
              *pdVar1 = *pdVar1 + -1;
              UNLOCK();
              if (*pdVar1 == 0) {
                pSVar6 = (pPVar25->program).m_state;
                if (pSVar6 != (SharedPtrStateBase *)0x0) {
                  (*pSVar6->_vptr_SharedPtrStateBase[1])();
                }
                (pPVar25->program).m_state = (SharedPtrStateBase *)0x0;
              }
            }
            pPVar25 = pPVar25 + 1;
          } while (pPVar25 != pPVar4);
        }
        pIVar7 = local_300;
        if (pPVar5 != (pointer)0x0) {
          operator_delete(pPVar5,(long)(local_300->m_programs).
                                       super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                 (long)pPVar5);
        }
        (pIVar7->m_programs).
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program>_>
        ._M_impl.super__Vector_impl_data._M_start = pPVar13;
        (pIVar7->m_programs).
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program>_>
        ._M_impl.super__Vector_impl_data._M_finish = pPVar22;
        (pIVar7->m_programs).
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = pPVar13 + uVar28;
      }
      else {
        pPVar4->usePointMode = bVar29;
        pPVar4->winding = local_3cc;
        (pPVar4->program).m_ptr = pSVar11;
        (pPVar4->program).m_state = local_340;
        if (local_340 != (SharedPtrStateBase *)0x0) {
          LOCK();
          local_340->strongRefCount = local_340->strongRefCount + 1;
          UNLOCK();
          LOCK();
          pdVar1 = &((pPVar4->program).m_state)->weakRefCount;
          *pdVar1 = *pdVar1 + 1;
          UNLOCK();
        }
        ppPVar2 = &(pIVar7->m_programs).
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppPVar2 = *ppPVar2 + 1;
      }
      pSVar6 = local_340;
      if (local_340 != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &local_340->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_348 = (ShaderProgram *)0x0;
          (*local_340->_vptr_SharedPtrStateBase[2])(local_340);
        }
        LOCK();
        pdVar1 = &pSVar6->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          if (local_340 != (SharedPtrStateBase *)0x0) {
            (*local_340->_vptr_SharedPtrStateBase[1])();
          }
          local_340 = (SharedPtrStateBase *)0x0;
        }
      }
      if (local_330 != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &local_330->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_338 = (ShaderProgram *)0x0;
          (*local_330->_vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar1 = &local_330->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          if (local_330 != (SharedPtrStateBase *)0x0) {
            (*local_330->_vptr_SharedPtrStateBase[1])();
          }
          local_330 = (SharedPtrStateBase *)0x0;
        }
      }
      if ((ContextInfo *)local_230._0_8_ != (ContextInfo *)(local_230 + 0x10)) {
        operator_delete((void *)local_230._0_8_,local_230._16_8_ + 1);
      }
      if (local_290 != (ContextInfo *)local_280) {
        operator_delete(local_290,(ulong)((long)&((_Alloc_hider *)local_280._0_8_)->_M_p + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
        operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      }
      if ((char *)local_3a0._8_8_ != local_390._M_local_buf + 8) {
        operator_delete((void *)local_3a0._8_8_,local_390._8_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_370._M_dataplus._M_p != &local_370.field_2) {
        operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
      }
      if ((char *)local_3f8._8_8_ != local_3e8._M_local_buf + 8) {
        operator_delete((void *)local_3f8._8_8_,local_3e8._8_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
        operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_100);
      std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
                (&local_120);
      lVar21 = 0x78;
      do {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_1b0 + lVar21));
        this = local_300;
        lVar21 = lVar21 + -0x18;
      } while (lVar21 != -0x18);
      log = ((local_300->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
      std::ostream::operator<<((ostringstream *)local_1b0,(int)local_328);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
      std::ios_base::~ios_base(local_140);
      plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_378,0,(char *)0x0,0x96fcef);
      paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar10 == paVar16) {
        local_3e8._M_allocated_capacity = paVar16->_M_allocated_capacity;
        local_3e8._8_8_ = plVar10[3];
        local_3f8._0_8_ = &local_3e8;
      }
      else {
        local_3e8._M_allocated_capacity = paVar16->_M_allocated_capacity;
        local_3f8._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar10;
      }
      local_3f8._8_8_ = plVar10[1];
      *plVar10 = (long)paVar16;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
      std::ostream::operator<<((ostringstream *)local_1b0,(int)local_328);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
      std::ios_base::~ios_base(local_140);
      plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_3c8,0,(char *)0x0,0x956ee4);
      uVar12 = local_328;
      local_3a0._0_8_ = &local_390;
      paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar10 == paVar16) {
        local_390._M_allocated_capacity = paVar16->_M_allocated_capacity;
        local_390._8_8_ = plVar10[3];
      }
      else {
        local_390._M_allocated_capacity = paVar16->_M_allocated_capacity;
        local_3a0._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar10;
      }
      local_3a0._8_8_ = plVar10[1];
      *plVar10 = (long)paVar16;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      tcu::ScopedLogSection::ScopedLogSection
                ((ScopedLogSection *)&local_2f0,log,(string *)local_3f8,(string *)local_3a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a0._0_8_ != &local_390) {
        operator_delete((void *)local_3a0._0_8_,local_390._M_allocated_capacity + 1);
      }
      if (local_3c8 != &local_3c0._M_string_length) {
        operator_delete(local_3c8,local_3c0._M_string_length + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f8._0_8_ != &local_3e8) {
        operator_delete((void *)local_3f8._0_8_,local_3e8._M_allocated_capacity + 1);
      }
      if (local_378 != &local_370._M_string_length) {
        operator_delete(local_378,local_370._M_string_length + 1);
      }
      pSVar11 = (this->m_programs).
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1].program.m_ptr;
      iVar27 = (int)uVar12;
      if ((iVar27 == 0) || (bVar8 = (pSVar11->m_program).m_info.linkOk, (bool)bVar8 == false)) {
        glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                        pSVar11);
        bVar8 = (((this->m_programs).
                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1].program.m_ptr)->m_program).m_info.
                linkOk;
      }
      if ((bVar8 & 1) == 0) {
        this_01 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_01,"Program compilation failed",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
                   ,0xfa4);
        __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      if (0 < iVar27) {
        local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        this_00 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Note: program ",0xe);
        std::ostream::operator<<(this_00,iVar27);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,
                   " is similar to above, except some constants are different, and: ",0x40);
        (anonymous_namespace)::InvariantOuterEdgeCase::Program::description_abi_cxx11_
                  ((string *)local_3f8,
                   (this->m_programs).
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1b0 + 8),(char *)local_3f8._0_8_,local_3f8._8_8_);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._0_8_ != &local_3e8) {
          operator_delete((void *)local_3f8._0_8_,local_3e8._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
        std::ios_base::~ios_base(local_138);
      }
      tcu::TestLog::endSection((TestLog *)local_2f0._M_dataplus._M_p);
      uVar20 = extraout_RDX_00;
      if ((Context *)local_320._0_8_ != (Context *)(local_320 + 0x10)) {
        operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
        uVar20 = extraout_RDX_01;
      }
      if (local_2d0 != &local_2c0) {
        operator_delete(local_2d0,(ulong)((long)&(local_2c0.m_testCtx)->m_platform + 1));
        uVar20 = extraout_RDX_02;
      }
      if (local_2c0.m_contextInfo != (ContextInfo *)local_2a0) {
        operator_delete(local_2c0.m_contextInfo,(ulong)((long)(Platform **)local_2a0._0_8_ + 1));
        uVar20 = extraout_RDX_03;
      }
      if (local_250[0] != (_Base_ptr)local_240) {
        operator_delete(local_250[0],(ulong)((long)&local_240[0]->m_platform + 1));
        uVar20 = extraout_RDX_04;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280._16_8_ != &local_260) {
        operator_delete((void *)local_280._16_8_,(ulong)(local_260._M_allocated_capacity + 1));
        uVar20 = extraout_RDX_05;
      }
      winding = WINDING_CW;
      uVar15 = 0;
    } while ((local_2f4 & 1) != 0);
    local_3cc = WINDING_CW;
    if ((local_2f8 & 1) == 0) {
      return 0;
    }
  } while( true );
}

Assistant:

void InvariantOuterEdgeCase::init (void)
{
	checkTessellationSupport(m_context);
	checkRenderTargetSize(m_context.getRenderTarget(), RENDER_SIZE);

	for (int windingI = 0; windingI < WINDING_LAST; windingI++)
	{
		const Winding winding = (Winding)windingI;

		for (int usePointModeI = 0; usePointModeI <= 1; usePointModeI++)
		{
			const bool		usePointMode	= usePointModeI != 0;
			const int		programNdx		= (int)m_programs.size();
			const string	floatLit01		= de::floatToString(10.0f / (float)(programNdx + 10), 2);

			std::string vertexShaderTemplate			("${GLSL_VERSION_DECL}\n"
														 "\n"
														 "in highp float in_v_attr;\n"
														 "out highp float in_tc_attr;\n"
														 "\n"
														 "void main (void)\n"
														 "{\n"
														 "	in_tc_attr = in_v_attr;\n"
														 "}\n");
			std::string tessellationControlTemplate		("${GLSL_VERSION_DECL}\n"
														 "${TESSELLATION_SHADER_REQUIRE}\n"
														 "\n"
														 "layout (vertices = " + de::toString(programNdx+1) + ") out;\n"
														 "\n"
														 "in highp float in_tc_attr[];\n"
														 "\n"
														 "void main (void)\n"
														 "{\n"
														 "	gl_TessLevelInner[0] = in_tc_attr[0];\n"
														 "	gl_TessLevelInner[1] = in_tc_attr[1];\n"
														 "\n"
														 "	gl_TessLevelOuter[0] = in_tc_attr[2];\n"
														 "	gl_TessLevelOuter[1] = in_tc_attr[3];\n"
														 "	gl_TessLevelOuter[2] = in_tc_attr[4];\n"
														 "	gl_TessLevelOuter[3] = in_tc_attr[5];\n"
														 "}\n");
			std::string tessellationEvaluationTemplate	("${GLSL_VERSION_DECL}\n"
														 "${TESSELLATION_SHADER_REQUIRE}\n"
														 "\n"
														 + getTessellationEvaluationInLayoutString(m_primitiveType, m_spacing, winding, usePointMode) +
														 "\n"
														 "out highp vec4 in_f_color;\n"
														 "invariant out highp vec3 out_te_tessCoord;\n"
														 "\n"
														 "void main (void)\n"
														 "{\n"
														 "	gl_Position = vec4(gl_TessCoord.xy*" + floatLit01 + " - float(gl_PrimitiveID)*0.05, 0.0, 1.0);\n"
														 "	in_f_color = vec4(" + floatLit01 + ");\n"
														 "	out_te_tessCoord = gl_TessCoord;\n"
														 "}\n");
			std::string fragmentShaderTemplate			("${GLSL_VERSION_DECL}\n"
														 "\n"
														 "layout (location = 0) out mediump vec4 o_color;\n"
														 "\n"
														 "in highp vec4 in_f_color;\n"
														 "\n"
														 "void main (void)\n"
														 "{\n"
														 "	o_color = in_f_color;\n"
														 "}\n");

			m_programs.push_back(Program(winding, usePointMode,
										 SharedPtr<const ShaderProgram>(new ShaderProgram(m_context.getRenderContext(), glu::ProgramSources()
				<< glu::VertexSource					(specializeShader(m_context, vertexShaderTemplate.c_str()))
				<< glu::TessellationControlSource		(specializeShader(m_context, tessellationControlTemplate.c_str()))
				<< glu::TessellationEvaluationSource	(specializeShader(m_context, tessellationEvaluationTemplate.c_str()))
				<< glu::FragmentSource					(specializeShader(m_context, fragmentShaderTemplate.c_str()))
				<< glu::TransformFeedbackVarying		("out_te_tessCoord")
				<< glu::TransformFeedbackMode			(GL_INTERLEAVED_ATTRIBS)))));

			{
				const tcu::ScopedLogSection section(m_testCtx.getLog(), "Program" + de::toString(programNdx), "Program " + de::toString(programNdx));

				if (programNdx == 0 || !m_programs.back().program->isOk())
					m_testCtx.getLog() << *m_programs.back().program;

				if (!m_programs.back().program->isOk())
					TCU_FAIL("Program compilation failed");

				if (programNdx > 0)
					m_testCtx.getLog() << TestLog::Message << "Note: program " << programNdx << " is similar to above, except some constants are different, and: " << m_programs.back().description() << TestLog::EndMessage;
			}
		}
	}
}